

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O1

Fl_Boxtype fl_define_FL_PLASTIC_UP_BOX(void)

{
  fl_internal_boxtype(_FL_PLASTIC_UP_BOX,up_box);
  fl_internal_boxtype(_FL_PLASTIC_DOWN_BOX,down_box);
  fl_internal_boxtype(_FL_PLASTIC_UP_FRAME,up_frame);
  fl_internal_boxtype(_FL_PLASTIC_DOWN_FRAME,down_frame);
  fl_internal_boxtype(_FL_PLASTIC_THIN_UP_BOX,thin_up_box);
  fl_internal_boxtype(_FL_PLASTIC_THIN_DOWN_BOX,down_box);
  fl_internal_boxtype(_FL_PLASTIC_ROUND_UP_BOX,up_round);
  fl_internal_boxtype(_FL_PLASTIC_ROUND_DOWN_BOX,down_round);
  return _FL_PLASTIC_UP_BOX;
}

Assistant:

Fl_Boxtype fl_define_FL_PLASTIC_UP_BOX() {
  fl_internal_boxtype(_FL_PLASTIC_UP_BOX, up_box);
  fl_internal_boxtype(_FL_PLASTIC_DOWN_BOX, down_box);
  fl_internal_boxtype(_FL_PLASTIC_UP_FRAME, up_frame);
  fl_internal_boxtype(_FL_PLASTIC_DOWN_FRAME, down_frame);
  fl_internal_boxtype(_FL_PLASTIC_THIN_UP_BOX, thin_up_box);
  fl_internal_boxtype(_FL_PLASTIC_THIN_DOWN_BOX, down_box);
  fl_internal_boxtype(_FL_PLASTIC_ROUND_UP_BOX, up_round);
  fl_internal_boxtype(_FL_PLASTIC_ROUND_DOWN_BOX, down_round);

  return _FL_PLASTIC_UP_BOX;
}